

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast.hpp
# Opt level: O0

int * chaiscript::boxed_cast<std::reference_wrapper<int>const>
                (Boxed_Value *bv,Type_Conversions_State *t_conversions)

{
  bool bVar1;
  Type_Info *pTVar2;
  Type_Conversions *pTVar3;
  int *piVar4;
  Conversion_Saves *t_saves;
  Conversion_Saves *from;
  bad_boxed_cast *this;
  byte local_c1;
  byte local_b1;
  bad_any_cast *anon_var_0_1;
  Boxed_Value local_60;
  bad_any_cast *anon_var_0;
  Type_Info local_38;
  Type_Conversions_State *local_20;
  Type_Conversions_State *t_conversions_local;
  Boxed_Value *bv_local;
  
  local_b1 = 1;
  local_20 = t_conversions;
  t_conversions_local = (Type_Conversions_State *)bv;
  if (t_conversions != (Type_Conversions_State *)0x0) {
    pTVar2 = Boxed_Value::get_type_info(bv);
    user_type<std::reference_wrapper<int>const>();
    bVar1 = Type_Info::bare_equal(pTVar2,&local_38);
    local_b1 = 1;
    if (!bVar1) {
      local_c1 = 0;
      if (local_20 != (Type_Conversions_State *)0x0) {
        pTVar3 = Type_Conversions_State::operator->(local_20);
        bVar1 = Type_Conversions::convertable_type<std::reference_wrapper<int>const>(pTVar3);
        local_c1 = bVar1 ^ 0xff;
      }
      local_b1 = local_c1;
    }
  }
  if ((local_b1 & 1) == 0) {
    if (local_20 != (Type_Conversions_State *)0x0) {
      pTVar3 = Type_Conversions_State::operator->(local_20);
      bVar1 = Type_Conversions::convertable_type<std::reference_wrapper<int>const>(pTVar3);
      if (bVar1) {
        t_saves = (Conversion_Saves *)Type_Conversions_State::operator->(local_20);
        from = Type_Conversions_State::saves(local_20);
        Type_Conversions::boxed_type_conversion<std::reference_wrapper<int>const>
                  ((Type_Conversions *)&local_60,t_saves,(Boxed_Value *)from);
        bv_local = (Boxed_Value *)
                   detail::Cast_Helper<const_std::reference_wrapper<int>_>::cast(&local_60,local_20)
        ;
        Boxed_Value::~Boxed_Value(&local_60);
        return (int *)bv_local;
      }
    }
    this = (bad_boxed_cast *)__cxa_allocate_exception(0x38);
    pTVar2 = Boxed_Value::get_type_info((Boxed_Value *)t_conversions_local);
    exception::bad_boxed_cast::bad_boxed_cast
              (this,*pTVar2,(type_info *)&std::reference_wrapper<int>::typeinfo);
    __cxa_throw(this,&exception::bad_boxed_cast::typeinfo,exception::bad_boxed_cast::~bad_boxed_cast
               );
  }
  piVar4 = detail::Cast_Helper<const_std::reference_wrapper<int>_>::cast
                     ((Boxed_Value *)t_conversions_local,local_20);
  return piVar4;
}

Assistant:

decltype(auto) boxed_cast(const Boxed_Value &bv, const Type_Conversions_State *t_conversions = nullptr) {
    if (!t_conversions || bv.get_type_info().bare_equal(user_type<Type>()) || (t_conversions && !(*t_conversions)->convertable_type<Type>())) {
      try {
        return detail::Cast_Helper<Type>::cast(bv, t_conversions);
      } catch (const chaiscript::detail::exception::bad_any_cast &) {
      }
    }

    if (t_conversions && (*t_conversions)->convertable_type<Type>()) {
      try {
        // We will not catch any bad_boxed_dynamic_cast that is thrown, let the user get it
        // either way, we are not responsible if it doesn't work
        return (detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_conversion<Type>(t_conversions->saves(), bv), t_conversions));
      } catch (...) {
        try {
          // try going the other way
          return (detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_down_conversion<Type>(t_conversions->saves(), bv),
                                                  t_conversions));
        } catch (const chaiscript::detail::exception::bad_any_cast &) {
          throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
        }
      }
    } else {
      // If it's not convertable, just throw the error, don't waste the time on the
      // attempted dynamic_cast
      throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
    }
  }